

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O2

void ggml_quantize_mat_t<4l,(ggml_type)8>(float *x,void *vy,int64_t nrow,int64_t n_per_row)

{
  float fVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  float *pfVar6;
  ulong uVar7;
  int j_1;
  ulong uVar8;
  uint uVar9;
  float *pfVar10;
  int row_iter;
  long lVar11;
  int j;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float afStack_228 [4];
  float local_218 [128];
  
  auVar13._8_4_ = 0x3effffff;
  auVar13._0_8_ = 0x3effffff3effffff;
  auVar13._12_4_ = 0x3effffff;
  auVar14._8_4_ = 0x80000000;
  auVar14._0_8_ = 0x8000000080000000;
  auVar14._12_4_ = 0x80000000;
  auVar15._8_4_ = 0x7fffffff;
  auVar15._0_8_ = 0x7fffffff7fffffff;
  auVar15._12_4_ = 0x7fffffff;
  uVar4 = (uint)(n_per_row / 0x20);
  lVar5 = (long)vy + 8;
  for (uVar7 = 0; uVar7 != (~((int)uVar4 >> 0x1f) & uVar4); uVar7 = uVar7 + 1) {
    pfVar6 = local_218;
    pfVar10 = x;
    for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
      auVar17 = ZEXT816(0) << 0x40;
      lVar12 = 0;
      while (lVar12 != 0x20) {
        fVar1 = pfVar10[lVar12];
        pfVar6[lVar12] = fVar1;
        auVar16 = vandps_avx(ZEXT416((uint)fVar1),auVar15);
        lVar12 = lVar12 + 1;
        auVar17 = vmaxss_avx(auVar17,auVar16);
      }
      auVar16._0_4_ = auVar17._0_4_ / 127.0;
      auVar16._4_12_ = auVar17._4_12_;
      pfVar6 = pfVar6 + 0x20;
      pfVar10 = pfVar10 + n_per_row;
      uVar2 = vcmpss_avx512f(auVar16,ZEXT816(0) << 0x40,4);
      auVar17 = vcvtps2ph_f16c(auVar16,0);
      vpextrw_avx(auVar17,0);
      afStack_228[lVar11] = (float)((uint)((byte)uVar2 & 1) * (int)(1.0 / auVar16._0_4_));
    }
    for (uVar8 = 0; uVar8 != 0x80; uVar8 = uVar8 + 1) {
      uVar3 = (uint)(uVar8 >> 2);
      uVar9 = uVar3 & 3;
      fVar1 = *(float *)((long)local_218 +
                        (ulong)((uint)uVar8 & 3 | uVar3 & 0x1c) * 4 + (ulong)(uVar9 << 7)) *
              afStack_228[uVar9];
      auVar17 = vpternlogd_avx512vl(auVar13,ZEXT416((uint)fVar1),auVar14,0xf8);
      auVar17 = ZEXT416((uint)(fVar1 + auVar17._0_4_));
      auVar17 = vroundss_avx(auVar17,auVar17,0xb);
      *(char *)(lVar5 + uVar8) = (char)(int)auVar17._0_4_;
    }
    x = x + 0x20;
    lVar5 = lVar5 + 0x88;
  }
  return;
}

Assistant:

void ggml_quantize_mat_t<4, GGML_TYPE_Q8_0>(const float * GGML_RESTRICT x, void * GGML_RESTRICT vy, int64_t nrow, int64_t n_per_row) {
    assert(nrow == 4);
    UNUSED(nrow);
    ggml_quantize_mat_q8_0_4x4(x, vy, n_per_row);
}